

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O1

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariable(cmCommandArgumentParserHelper *this,char *var)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  _Alloc_hider _Var6;
  char *__s;
  ostringstream ostr;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  if (var == (char *)0x0) {
    return (char *)0x0;
  }
  if ((-1 < this->FileLine) && (iVar3 = strcmp(var,"CMAKE_CURRENT_LIST_LINE"), iVar3 == 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<long>((long)local_1a8);
    std::__cxx11::stringbuf::str();
    pcVar5 = AddString(this,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    return pcVar5;
  }
  pcVar2 = this->Makefile;
  paVar1 = &local_1a8[0].field_2;
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
  sVar4 = strlen(var);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,var,var + sVar4);
  pcVar5 = cmMakefile::GetDefinition(pcVar2,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  if (pcVar5 == (char *)0x0) {
    pcVar2 = this->Makefile;
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
    sVar4 = strlen(var);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,var,var + sVar4);
    cmMakefile::MaybeWarnUninitialized(pcVar2,local_1a8,this->FileName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if (this->RemoveEmpty == false) {
      return (char *)0x0;
    }
  }
  if ((pcVar5 == (char *)0x0) || (this->EscapeQuotes == false)) {
    __s = "";
    if (pcVar5 != (char *)0x0) {
      __s = pcVar5;
    }
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
    sVar4 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,__s,__s + sVar4);
    pcVar5 = AddString(this,local_1a8);
    _Var6._M_p = local_1a8[0]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p == paVar1) {
      return pcVar5;
    }
  }
  else {
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    sVar4 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,pcVar5,pcVar5 + sVar4);
    cmSystemTools::EscapeQuotes(local_1a8,&local_1c8);
    pcVar5 = AddString(this,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    local_1a8[0].field_2._M_allocated_capacity = local_1c8.field_2._M_allocated_capacity;
    _Var6._M_p = local_1c8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p == &local_1c8.field_2) {
      return pcVar5;
    }
  }
  operator_delete(_Var6._M_p,local_1a8[0].field_2._0_8_ + 1);
  return pcVar5;
}

Assistant:

const char* cmCommandArgumentParserHelper::ExpandVariable(const char* var)
{
  if (!var) {
    return nullptr;
  }
  if (this->FileLine >= 0 && strcmp(var, "CMAKE_CURRENT_LIST_LINE") == 0) {
    std::ostringstream ostr;
    ostr << this->FileLine;
    return this->AddString(ostr.str());
  }
  const char* value = this->Makefile->GetDefinition(var);
  if (!value) {
    this->Makefile->MaybeWarnUninitialized(var, this->FileName);
    if (!this->RemoveEmpty) {
      return nullptr;
    }
  }
  if (this->EscapeQuotes && value) {
    return this->AddString(cmSystemTools::EscapeQuotes(value));
  }
  return this->AddString(value ? value : "");
}